

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O3

Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
* __thiscall
Lib::
Map<const_Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>_*,_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
::insert(Map<const_Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>_*,_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
         *this,MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> **key,
        Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
        *val,uint code)

{
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  Entry *pEVar5;
  Entry *pEVar6;
  
  pEVar5 = this->_entries;
  uVar2 = (ulong)code % (ulong)(uint)this->_capacity;
  pEVar6 = pEVar5 + uVar2;
  uVar4 = pEVar5[uVar2].code;
  while (uVar4 != 0) {
    if (uVar4 == code) {
      bVar3 = Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::operator==
                        ((Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                          *)pEVar6->_key,&(*key)->_factors);
      if (bVar3) goto LAB_002e7e7b;
      pEVar5 = this->_entries;
    }
    pEVar6 = pEVar6 + 1;
    if (pEVar6 == this->_afterLast) {
      pEVar6 = pEVar5;
    }
    uVar4 = pEVar6->code;
  }
  this->_noOfEntries = this->_noOfEntries + 1;
  uVar4 = val->_id;
  pMVar1 = val->_ptr;
  pEVar6->_key = (MaybeUninit<const_Kernel::MonomFactors<Kernel::NumTraits<RealConstantType>_>_*>)
                 *key;
  *(uint *)&pEVar6->_value = uVar4;
  *(MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> **)((long)&pEVar6->_value + 8) =
       pMVar1;
  pEVar6->code = code;
LAB_002e7e7b:
  return (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
          *)&pEVar6->_value;
}

Assistant:

Val& insert(Key&& key, Val&& val,unsigned code)
  {
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return entry->value();
      }
    }
    // entry is not occupied
    _noOfEntries++;
    entry->init(std::move(key), std::move(val), code);
    return entry->value();
  }